

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_timestep_embedding(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ggml_tensor *pgVar5;
  long lVar6;
  size_t sVar7;
  void *pvVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  undefined1 auVar15 [64];
  long local_68;
  long local_60;
  undefined1 extraout_var [60];
  
  pgVar5 = dst->src[0];
  if (pgVar5->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1a88,"fatal error");
  }
  if (pgVar5->nb[0] != 4) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1a60,"GGML_ASSERT(%s) failed","src0->nb[0] == sizeof(float)");
  }
  lVar6 = pgVar5->ne[0];
  if (0 < lVar6) {
    sVar7 = dst->nb[1];
    iVar1 = dst->op_params[0];
    iVar10 = iVar1 / 2;
    iVar2 = params->nth;
    iVar3 = params->ith;
    iVar4 = dst->op_params[1];
    local_60 = (long)iVar10 * 4;
    local_68 = 0;
    lVar9 = 0;
    do {
      pvVar8 = dst->data;
      lVar11 = (long)iVar3;
      if (iVar3 < iVar10) {
        do {
          fVar14 = *(float *)((long)pgVar5->data + lVar9 * 4);
          auVar15._0_4_ = logf((float)iVar4);
          auVar15._4_60_ = extraout_var;
          auVar12._8_4_ = 0x80000000;
          auVar12._0_8_ = 0x8000000080000000;
          auVar12._12_4_ = 0x80000000;
          auVar12 = vxorps_avx512vl(auVar15._0_16_,auVar12);
          fVar13 = expf(((float)lVar11 * auVar12._0_4_) / (float)iVar10);
          fVar13 = fVar13 * fVar14;
          fVar14 = cosf(fVar13);
          *(float *)((long)pvVar8 + lVar11 * 4 + local_68) = fVar14;
          fVar14 = sinf(fVar13);
          *(float *)((long)pvVar8 + lVar11 * 4 + local_60) = fVar14;
          lVar11 = lVar11 + iVar2;
        } while (lVar11 < iVar10);
      }
      if (((long)iVar3 == 0 & (byte)iVar1) != 0) {
        *(undefined4 *)((long)pvVar8 + (long)iVar1 * 4 + lVar9 * sVar7) = 0;
      }
      lVar9 = lVar9 + 1;
      local_60 = local_60 + sVar7;
      local_68 = local_68 + sVar7;
    } while (lVar9 != lVar6);
  }
  return;
}

Assistant:

void ggml_compute_forward_timestep_embedding(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_timestep_embedding_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}